

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O3

int NALUnit::calcNalLenInBits(uint8_t *nalBuffer,uint8_t *end)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  
  iVar2 = 0;
  if (nalBuffer < end) {
    iVar2 = 1;
    if ((end[-1] & 1) == 0) {
      bVar3 = end[-1] | 0x80;
      do {
        iVar2 = iVar2 + 1;
        bVar1 = bVar3 & 2;
        bVar3 = bVar3 >> 1;
      } while (bVar1 == 0);
    }
    iVar2 = ((int)end - (int)nalBuffer) * 8 - iVar2;
  }
  return iVar2;
}

Assistant:

int NALUnit::calcNalLenInBits(const uint8_t* nalBuffer, const uint8_t* end)
{
    if (end > nalBuffer)
    {
        int trailing = 1;
        uint8_t data = end[-1] | 0x80;
        while ((data & 1) == 0)
        {
            data >>= 1;
            trailing++;
        }
        return static_cast<int>(end - nalBuffer) * 8 - trailing;
    }
    return 0;
}